

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::VarAssign::handle(VarAssign *this,Module *m)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *__rhs;
  int __c;
  __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
  *__rhs_00;
  _Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true> local_58;
  _Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true> local_50;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *local_48;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *var;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  variant<hgdb::json::Variable,_unsigned_long> *variable;
  iterator __end3;
  iterator __begin3;
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  *__range3;
  Module *m_local;
  VarAssign *this_local;
  
  __end3 = std::
           vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ::begin(&m->variables_);
  variable = (variant<hgdb::json::Variable,_unsigned_long> *)
             std::
             vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
             ::end(&m->variables_);
  while( true ) {
    __rhs_00 = (__normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
                *)&variable;
    bVar1 = __gnu_cxx::operator!=(&__end3,__rhs_00);
    if (!bVar1) break;
    var = (variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *)
          __gnu_cxx::
          __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
          ::operator*(&__end3);
    v = (variant<hgdb::json::Variable,_unsigned_long> *)var;
    pcVar2 = std::variant<hgdb::json::Variable,_unsigned_long>::index
                       ((variant<hgdb::json::Variable,_unsigned_long> *)var,(char *)__rhs_00,__c);
    if (pcVar2 == (char *)0x0) {
      local_48 = std::get<0ul,hgdb::json::Variable,unsigned_long>
                           ((variant<hgdb::json::Variable,_unsigned_long> *)var);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
           ::find(this->id_,local_48);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
           ::end(this->id_);
      bVar1 = std::__detail::operator!=(&local_50,&local_58);
      if (bVar1) {
        __rhs = std::
                unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
                ::at(this->id_,local_48);
        std::variant<hgdb::json::Variable,unsigned_long>::operator=
                  ((variant<hgdb::json::Variable,unsigned_long> *)v,__rhs);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void handle(Module *m) override {
            for (auto &variable : m->variables_) {
                auto const &v = variable;
                if (v.index() == 0) {
                    auto const &var = std::get<0>(v);
                    if (id_.find(var) != id_.end()) {
                        variable = id_.at(var);
                    }
                }
            }
        }